

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

char * fmt::v6::detail::
       parse_format_specs<char,fmt::v6::detail::specs_checker<fmt::v6::detail::specs_handler<fmt::v6::basic_format_parse_context<char,fmt::v6::detail::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>>,char>>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v6::detail::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::detail::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>_>
                 *handler)

{
  undefined1 *puVar1;
  error_handler eVar2;
  basic_format_specs<char> *pbVar3;
  byte bVar4;
  uint uVar5;
  width_adapter<fmt::v6::detail::specs_checker<fmt::v6::detail::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::detail::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>_>_&,_char>
  in_RAX;
  error_handler *peVar6;
  type tVar7;
  char *unaff_RBX;
  error_handler *peVar8;
  
  if (begin == end) {
    return begin;
  }
  if (*begin == '}') {
    return begin;
  }
  peVar6 = (error_handler *)
           parse_align<char,fmt::v6::detail::specs_checker<fmt::v6::detail::specs_handler<fmt::v6::basic_format_parse_context<char,fmt::v6::detail::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>>,char>>>&>
                     (begin,end,handler);
  if (peVar6 == (error_handler *)end) {
    return (char *)peVar6;
  }
  eVar2 = *peVar6;
  if (eVar2 == (error_handler)0x20) {
    tVar7 = (handler->checker_).arg_type_;
    uVar5 = tVar7 - int_type;
    if (10 < uVar5) goto LAB_0018c2c0;
    bVar4 = 0x30;
LAB_0018c16b:
    if ((uVar5 < 8) && ((char_type < tVar7 || ((0x10aU >> (tVar7 & 0x1f) & 1) == 0)))) {
      error_handler::on_error(peVar6,"format specifier requires signed argument");
    }
    pbVar3 = (handler->
             super_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::detail::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
             ).super_specs_setter<char>.specs_;
    pbVar3->field_0x9 = pbVar3->field_0x9 & 0x8f | bVar4;
    peVar6 = peVar6 + 1;
  }
  else {
    if (eVar2 == (error_handler)0x2d) {
      tVar7 = (handler->checker_).arg_type_;
      uVar5 = tVar7 - int_type;
      if (10 < uVar5) goto LAB_0018c2c0;
      bVar4 = 0x10;
      goto LAB_0018c16b;
    }
    if (eVar2 == (error_handler)0x2b) {
      tVar7 = (handler->checker_).arg_type_;
      uVar5 = tVar7 - int_type;
      if (10 < uVar5) goto LAB_0018c2c0;
      bVar4 = 0x20;
      goto LAB_0018c16b;
    }
  }
  if (peVar6 != (error_handler *)end) {
    if (*peVar6 == (error_handler)0x23) {
      if (10 < (handler->checker_).arg_type_ - int_type) goto LAB_0018c2c0;
      puVar1 = &((handler->
                 super_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::detail::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
                 ).super_specs_setter<char>.specs_)->field_0x9;
      *puVar1 = *puVar1 | 0x80;
      peVar6 = peVar6 + 1;
      if (peVar6 == (error_handler *)end) {
        return (char *)peVar6;
      }
    }
    if (*peVar6 == (error_handler)0x30) {
      if (10 < (handler->checker_).arg_type_ - int_type) {
LAB_0018c2c0:
        error_handler::on_error(peVar6,"format specifier requires numeric argument");
      }
      pbVar3 = (handler->
               super_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::detail::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
               ).super_specs_setter<char>.specs_;
      pbVar3->field_0x9 = pbVar3->field_0x9 & 0xf0 | 4;
      (((handler->
        super_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::detail::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
        ).super_specs_setter<char>.specs_)->fill).data_[0] = '0';
      peVar6 = peVar6 + 1;
      if (peVar6 == (error_handler *)end) {
        return (char *)peVar6;
      }
    }
    if (peVar6 == (error_handler *)end) {
      assert_fail(unaff_RBX,0,(char *)in_RAX.handler);
    }
    if ((byte)((char)*peVar6 - 0x30U) < 10) {
      uVar5 = 0;
      while (peVar8 = peVar6 + 1, uVar5 < 0xccccccd) {
        uVar5 = ((int)(char)*peVar6 + uVar5 * 10) - 0x30;
        peVar6 = (error_handler *)end;
        if ((peVar8 == (error_handler *)end) || (peVar6 = peVar8, 9 < (byte)((char)*peVar8 - 0x30U))
           ) goto LAB_0018c280;
      }
      uVar5 = 0x80000000;
LAB_0018c280:
      if ((int)uVar5 < 0) {
        error_handler::on_error(peVar6,"number is too big");
      }
      ((handler->
       super_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::detail::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
       ).super_specs_setter<char>.specs_)->width = uVar5;
    }
    else if (*peVar6 == (error_handler)0x7b) {
      peVar6 = peVar6 + 1;
      if (peVar6 != (error_handler *)end) {
        peVar6 = (error_handler *)
                 parse_arg_id<char,fmt::v6::detail::width_adapter<fmt::v6::detail::specs_checker<fmt::v6::detail::specs_handler<fmt::v6::basic_format_parse_context<char,fmt::v6::detail::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>>,char>>>&,char>>
                           ((char *)peVar6,end,
                            (width_adapter<fmt::v6::detail::specs_checker<fmt::v6::detail::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::detail::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>_>_&,_char>
                             *)&stack0xffffffffffffffe8);
      }
      if ((peVar6 == (error_handler *)end) || (*peVar6 != (error_handler)0x7d)) {
        error_handler::on_error(peVar6,"invalid format string");
      }
      peVar6 = peVar6 + 1;
    }
    if (peVar6 != (error_handler *)end) {
      if (*peVar6 == (error_handler)0x2e) {
        peVar6 = (error_handler *)
                 parse_precision<char,fmt::v6::detail::specs_checker<fmt::v6::detail::specs_handler<fmt::v6::basic_format_parse_context<char,fmt::v6::detail::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>>,char>>>&>
                           ((char *)peVar6,end,handler);
      }
      if ((peVar6 != (error_handler *)end) && (eVar2 = *peVar6, eVar2 != (error_handler)0x7d)) {
        peVar6 = peVar6 + 1;
        ((handler->
         super_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::detail::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
         ).super_specs_setter<char>.specs_)->type = (char)eVar2;
      }
    }
  }
  return (char *)peVar6;
}

Assistant:

FMT_CONSTEXPR const Char* parse_format_specs(const Char* begin, const Char* end,
                                             SpecHandler&& handler) {
  if (begin == end || *begin == '}') return begin;

  begin = parse_align(begin, end, handler);
  if (begin == end) return begin;

  // Parse sign.
  switch (static_cast<char>(*begin)) {
  case '+':
    handler.on_plus();
    ++begin;
    break;
  case '-':
    handler.on_minus();
    ++begin;
    break;
  case ' ':
    handler.on_space();
    ++begin;
    break;
  }
  if (begin == end) return begin;

  if (*begin == '#') {
    handler.on_hash();
    if (++begin == end) return begin;
  }

  // Parse zero flag.
  if (*begin == '0') {
    handler.on_zero();
    if (++begin == end) return begin;
  }

  begin = parse_width(begin, end, handler);
  if (begin == end) return begin;

  // Parse precision.
  if (*begin == '.') {
    begin = parse_precision(begin, end, handler);
  }

  // Parse type.
  if (begin != end && *begin != '}') handler.on_type(*begin++);
  return begin;
}